

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

IVec4 tcu::getFormatMinIntValue(TextureFormat *format)

{
  ChannelType CVar1;
  int i;
  long lVar2;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  IVec4 IVar3;
  IVec4 IVar4;
  
  CVar1 = format->type;
  if (CVar1 == SIGNED_INT8) {
    lVar2 = 0;
    do {
      *(undefined4 *)((long)in_RDI + lVar2 * 4) = 0xffffff80;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else if (CVar1 == SIGNED_INT16) {
    lVar2 = 0;
    do {
      *(undefined4 *)((long)in_RDI + lVar2 * 4) = 0xffff8000;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    if (CVar1 != SIGNED_INT32) {
      *in_RDI = 0;
      in_RDI[1] = 0;
      IVar4.m_data._8_8_ = in_RDX;
      IVar4.m_data._0_8_ = in_RDI;
      return (IVec4)IVar4.m_data;
    }
    lVar2 = 0;
    do {
      *(undefined4 *)((long)in_RDI + lVar2 * 4) = 0x80000000;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  IVar3.m_data._8_8_ = in_RDX;
  IVar3.m_data._0_8_ = in_RDI;
  return (IVec4)IVar3.m_data;
}

Assistant:

IVec4 getFormatMinIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::min());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::min());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::min());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}